

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O2

void hufCanonicalCodeTable(uint64_t *hcode)

{
  long lVar1;
  ulong uVar2;
  int i;
  long lVar3;
  ulong uVar4;
  ulong auStack_1d8 [59];
  
  for (lVar3 = 0; lVar3 != 0x3b; lVar3 = lVar3 + 1) {
    auStack_1d8[lVar3] = 0;
  }
  for (lVar3 = 0; lVar3 != 0x10001; lVar3 = lVar3 + 1) {
    auStack_1d8[hcode[lVar3]] = auStack_1d8[hcode[lVar3]] + 1;
  }
  uVar4 = 0;
  for (lVar3 = 0x1d0; lVar3 != 0; lVar3 = lVar3 + -8) {
    lVar1 = *(long *)((long)auStack_1d8 + lVar3);
    *(ulong *)((long)auStack_1d8 + lVar3) = uVar4;
    uVar4 = lVar1 + uVar4 >> 1;
  }
  for (lVar3 = 0; lVar3 != 0x10001; lVar3 = lVar3 + 1) {
    uVar4 = hcode[lVar3];
    if (uVar4 != 0) {
      uVar2 = auStack_1d8[uVar4];
      auStack_1d8[uVar4] = uVar2 + 1;
      hcode[lVar3] = uVar2 << 6 | uVar4;
    }
  }
  return;
}

Assistant:

static void
hufCanonicalCodeTable (uint64_t* hcode)
{
    uint64_t n[59];

    //
    // For each i from 0 through 58, count the
    // number of different codes of length i, and
    // store the count in n[i].
    //

    for (int i = 0; i <= 58; ++i)
        n[i] = 0;

    for (int i = 0; i < HUF_ENCSIZE; ++i)
        n[hcode[i]] += 1;

    //
    // For each i from 58 through 1, compute the
    // numerically lowest code with length i, and
    // store that code in n[i].
    //

    uint64_t c = 0;

    for (int i = 58; i > 0; --i)
    {
        uint64_t nc = ((c + n[i]) >> 1);
        n[i]        = c;
        c           = nc;
    }

    //
    // hcode[i] contains the length, l, of the
    // code for symbol i.  Assign the next available
    // code of length l to the symbol and store both
    // l and the code in hcode[i].
    //

    for (int i = 0; i < HUF_ENCSIZE; ++i)
    {
        uint64_t l = hcode[i];

        if (l > 0) hcode[i] = l | (n[l]++ << 6);
    }
}